

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

String * __thiscall
asl::Date::toString(String *__return_storage_ptr__,Date *this,Format fmt,bool utc)

{
  double dVar1;
  uint uVar2;
  double local_198;
  undefined4 uStack_168;
  undefined4 uStack_164;
  char *mn [12];
  char *wd [7];
  String local_c8;
  String local_b0;
  String local_98;
  String local_70;
  undefined1 local_58 [8];
  String s;
  int local_38;
  DateData d;
  bool utc_local;
  Format fmt_local;
  Date *this_local;
  
  if ((this->_t != this->_t) || (NAN(this->_t) || NAN(this->_t))) {
    asl::String::String(__return_storage_ptr__,"?");
    return __return_storage_ptr__;
  }
  dVar1 = this->_t;
  if (utc) {
    local_198 = 0.0;
  }
  else {
    local_198 = localOffset(this);
  }
  calc((DateData *)((long)&s.field_2 + 0xc),dVar1 + local_198);
  uVar2 = clamp<int,int>(local_38,1,0xc);
  asl::String::String((String *)local_58);
  switch(fmt) {
  case LONG:
    asl::String::f(&local_70,"%04i-%02i-%02iT%02i:%02i:%02i",(ulong)(uint)s.field_2._12_4_,
                   (ulong)uVar2,(ulong)(uint)d.year,(ulong)(uint)d.month,d.day,d.hours);
    asl::String::operator=((String *)local_58,&local_70);
    asl::String::~String(&local_70);
    break;
  case SHORT:
    asl::String::String(&local_b0,0xf,"%04i%02i%02iT%02i%02i%02i",(ulong)(uint)s.field_2._12_4_,
                        (ulong)uVar2,(ulong)(uint)d.year,d.month,d.day,d.hours);
    asl::String::operator=((String *)local_58,&local_b0);
    asl::String::~String(&local_b0);
    break;
  case DATE_ONLY:
    asl::String::String(&local_c8,0xc,"%04i-%02i-%02i",(ulong)(uint)s.field_2._12_4_,(ulong)uVar2,
                        (ulong)(uint)d.year);
    asl::String::operator=((String *)local_58,&local_c8);
    asl::String::~String(&local_c8);
    break;
  case HTTP:
    mn[0xb] = "Sun";
    mn[9] = "Nov";
    mn[10] = "Dec";
    mn[7] = "Sep";
    mn[8] = "Oct";
    mn[5] = "Jul";
    mn[6] = "Aug";
    mn[3] = "May";
    mn[4] = "Jun";
    mn[1] = "Mar";
    mn[2] = "Apr";
    uStack_168 = 0x176f74;
    uStack_164 = 0;
    mn[0]._0_4_ = 0x176f78;
    mn[0]._4_4_ = 0;
    asl::String::f(__return_storage_ptr__,"%s, %02i %s %04i %02i:%02i:%02i GMT",
                   mn[(long)d.minutes + 0xb],(ulong)(uint)d.year,
                   *(undefined8 *)(&uStack_168 + (long)(int)(uVar2 - 1) * 2),
                   (ulong)(uint)s.field_2._12_4_,d.month,d.day,d.hours);
    goto LAB_001682e4;
  case FULL:
    dVar1 = fract<double>(this->_t);
    asl::String::f(&local_98,"%04i-%02i-%02iT%02i:%02i:%02i.%03i",(ulong)(uint)s.field_2._12_4_,
                   (ulong)uVar2,(ulong)(uint)d.year,(ulong)(uint)d.month,d.day,d.hours,
                   (int)(dVar1 * 1000.0 + 0.5) % 1000);
    asl::String::operator=((String *)local_58,&local_98);
    asl::String::~String(&local_98);
  }
  if (utc) {
    asl::String::operator+=((String *)local_58,'Z');
  }
  asl::String::String(__return_storage_ptr__,(String *)local_58);
LAB_001682e4:
  asl::String::~String((String *)local_58);
  return __return_storage_ptr__;
}

Assistant:

String Date::toString(Date::Format fmt, bool utc) const
{
	if (_t != _t)
		return "?";
	DateData d = calc(_t + (utc ? 0 : localOffset()));
	d.month = clamp(d.month, 1, 12);
	String   s;
	switch (fmt)
	{
	case LONG:
		s = String::f("%04i-%02i-%02iT%02i:%02i:%02i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds);
		break;
	case FULL:
		s = String::f("%04i-%02i-%02iT%02i:%02i:%02i.%03i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds,
		              int(1000 * fract(_t) + 0.5) % 1000);
		break;
	case SHORT:
		s = String(15, "%04i%02i%02iT%02i%02i%02i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds);
		break;
	case DATE_ONLY:
		s = String(12, "%04i-%02i-%02i", d.year, d.month, d.day);
		break;
	case HTTP:
	{
		const char* wd[] = { "Sun", "Mon", "Tue", "Wed", "Thu", "Fri", "Sat" };
		const char* mn[] = { "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };
		return String::f("%s, %02i %s %04i %02i:%02i:%02i GMT", wd[d.weekDay], d.day, mn[d.month - 1], d.year, d.hours, d.minutes,
		                 d.seconds);
	}
	}

	if (utc)
		s += 'Z';

	return s;
}